

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerOpenWal(Pager *pPager,int *pbOpen)

{
  int iVar1;
  int local_24;
  int rc;
  int *pbOpen_local;
  Pager *pPager_local;
  
  local_24 = 0;
  if ((pPager->tempFile == '\0') && (pPager->pWal == (Wal *)0x0)) {
    iVar1 = sqlite3PagerWalSupported(pPager);
    if (iVar1 == 0) {
      return 0xe;
    }
    sqlite3OsClose(pPager->jfd);
    local_24 = pagerOpenWal(pPager);
    if (local_24 == 0) {
      pPager->journalMode = '\x05';
      pPager->eState = '\0';
    }
  }
  else {
    *pbOpen = 1;
  }
  return local_24;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenWal(
  Pager *pPager,                  /* Pager object */
  int *pbOpen                     /* OUT: Set to true if call is a no-op */
){
  int rc = SQLITE_OK;             /* Return code */

  assert( assert_pager_state(pPager) );
  assert( pPager->eState==PAGER_OPEN   || pbOpen );
  assert( pPager->eState==PAGER_READER || !pbOpen );
  assert( pbOpen==0 || *pbOpen==0 );
  assert( pbOpen!=0 || (!pPager->tempFile && !pPager->pWal) );

  if( !pPager->tempFile && !pPager->pWal ){
    if( !sqlite3PagerWalSupported(pPager) ) return SQLITE_CANTOPEN;

    /* Close any rollback journal previously open */
    sqlite3OsClose(pPager->jfd);

    rc = pagerOpenWal(pPager);
    if( rc==SQLITE_OK ){
      pPager->journalMode = PAGER_JOURNALMODE_WAL;
      pPager->eState = PAGER_OPEN;
    }
  }else{
    *pbOpen = 1;
  }

  return rc;
}